

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pie.h
# Opt level: O3

int __thiscall PIE<8U>::Query(PIE<8U> *this,Data<8U> *data)

{
  Counter CVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  iVar5 = 0;
  uVar3 = Data<8U>::Hash(data,0);
  uVar2 = *(uint *)&(this->super_Abstract<8U>).field_0x6c;
  if (this->CYCLE != 0) {
    iVar5 = 0;
    uVar6 = 0;
    do {
      CVar1 = this->counter[*(int *)&(this->super_Abstract<8U>).field_0x6c * uVar6 + uVar3 % uVar2];
      uVar4 = Data<8U>::Hash(data,1);
      iVar5 = iVar5 + (uint)((uVar4 & 0x3fff) == (int)(short)CVar1 >> 2);
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->CYCLE);
  }
  return iVar5;
}

Assistant:

int Query(const Data<DATA_LEN>& data) {
		int ret = 0;
		uint position = data.Hash() % LENGTH;
		for (uint time = 0; time < CYCLE; ++time) {
			uint pos = position + time * LENGTH;
			if (counter[pos].print == (data.Hash(1) & MASK_PRINT)) ret += 1;
		}
		return ret;
	}